

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_rw_hook_replace_unsafe(intptr_t uuid,fio_rw_hook_s *rw_hooks,void *udata)

{
  int iVar1;
  int iVar2;
  intptr_t fd;
  uint8_t was_locked;
  int replaced;
  void *udata_local;
  fio_rw_hook_s *rw_hooks_local;
  intptr_t uuid_local;
  long lVar3;
  
  fd._4_4_ = -1;
  iVar1 = (int)((ulong)uuid >> 8);
  lVar3 = (long)iVar1;
  if (rw_hooks->read == (_func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *)0x0) {
    rw_hooks->read = fio_hooks_default_read;
  }
  if (rw_hooks->write == (_func_ssize_t_intptr_t_void_ptr_void_ptr_size_t *)0x0) {
    rw_hooks->write = fio_hooks_default_write;
  }
  if (rw_hooks->flush == (_func_ssize_t_intptr_t_void_ptr *)0x0) {
    rw_hooks->flush = fio_hooks_default_flush;
  }
  if (rw_hooks->before_close == (_func_ssize_t_intptr_t_void_ptr *)0x0) {
    rw_hooks->before_close = fio_hooks_default_before_close;
  }
  if (rw_hooks->cleanup == (_func_void_void_ptr *)0x0) {
    rw_hooks->cleanup = fio_hooks_default_cleanup;
  }
  iVar2 = fio_trylock((fio_lock_i *)((long)fio_data + lVar3 * 0xa8 + 0x6e));
  if (CONCAT41(iVar1,*(undefined1 *)((long)fio_data + lVar3 * 0xa8 + 0x6d)) == uuid) {
    *(fio_rw_hook_s **)((long)fio_data + lVar3 * 0xa8 + 0xa8) = rw_hooks;
    *(void **)((long)fio_data + lVar3 * 0xa8 + 0xb0) = udata;
    fd._4_4_ = 0;
  }
  if ((char)iVar2 == '\0') {
    fio_unlock((fio_lock_i *)((long)fio_data + lVar3 * 0xa8 + 0x6e));
  }
  return fd._4_4_;
}

Assistant:

int fio_rw_hook_replace_unsafe(intptr_t uuid, fio_rw_hook_s *rw_hooks,
                               void *udata) {
  int replaced = -1;
  uint8_t was_locked;
  intptr_t fd = fio_uuid2fd(uuid);
  if (!rw_hooks->read)
    rw_hooks->read = fio_hooks_default_read;
  if (!rw_hooks->write)
    rw_hooks->write = fio_hooks_default_write;
  if (!rw_hooks->flush)
    rw_hooks->flush = fio_hooks_default_flush;
  if (!rw_hooks->before_close)
    rw_hooks->before_close = fio_hooks_default_before_close;
  if (!rw_hooks->cleanup)
    rw_hooks->cleanup = fio_hooks_default_cleanup;
  /* protect against some fulishness... but not all of it. */
  was_locked = fio_trylock(&fd_data(fd).sock_lock);
  if (fd2uuid(fd) == uuid) {
    fd_data(fd).rw_hooks = rw_hooks;
    fd_data(fd).rw_udata = udata;
    replaced = 0;
  }
  if (!was_locked)
    fio_unlock(&fd_data(fd).sock_lock);
  return replaced;
}